

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  char *filename;
  pointer pbVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  cmSourceFile *pcVar7;
  string *psVar8;
  size_type sVar9;
  undefined8 unaff_RBP;
  const_iterator __begin3;
  pointer pbVar10;
  string incpath;
  string local_90;
  uint local_6c;
  string local_68;
  string *local_48;
  cmSourceFile *local_40;
  pointer local_38;
  
  if (info->DependDone == false) {
    info->DependDone = true;
    filename = (info->FullPath)._M_dataplus._M_p;
    if (filename == (char *)0x0) {
      cmSystemTools::Error
                ("Attempt to find dependencies for file without path!",(char *)0x0,(char *)0x0,
                 (char *)0x0);
      return;
    }
    bVar3 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar3) {
      DependWalk(this,info);
      local_6c = (uint)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    }
    else {
      local_6c = 0;
    }
    pcVar7 = info->SourceFile;
    if (pcVar7 != (cmSourceFile *)0x0) {
      pbVar10 = (pcVar7->Depends).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (pcVar7->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar10 != pbVar1) {
        do {
          AddDependency(this,info,(pbVar10->_M_dataplus)._M_p);
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != pbVar1);
        return;
      }
    }
    if ((char)local_6c == '\0') {
      this_00 = this->Makefile;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      sVar6 = strlen(filename);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,filename,filename + sVar6)
      ;
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_68,&local_90);
      pcVar7 = cmMakefile::GetSource(this_00,&local_68,Ambiguous);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pcVar7 != (cmSourceFile *)0x0) {
        psVar8 = cmSourceFile::GetFullPath(pcVar7,(string *)0x0);
        iVar4 = std::__cxx11::string::compare((char *)psVar8);
        if (iVar4 == 0) {
          return;
        }
        pbVar10 = (this->IncludeDirectories).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_38 = (this->IncludeDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar10 != local_38) {
          local_48 = (string *)&info->FullPath;
          local_40 = pcVar7;
          do {
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            pcVar2 = (pbVar10->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_68,pcVar2,pcVar2 + pbVar10->_M_string_length);
            if (local_68._M_string_length == 0) {
              sVar9 = 0;
            }
            else {
              sVar9 = local_68._M_string_length;
              if (local_68._M_dataplus._M_p[local_68._M_string_length - 1] != '/') {
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_90,local_68._M_dataplus._M_p,
                           local_68._M_dataplus._M_p + local_68._M_string_length);
                std::__cxx11::string::append((char *)&local_90);
                std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
                sVar9 = local_68._M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                  sVar9 = local_68._M_string_length;
                }
              }
            }
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,local_68._M_dataplus._M_p,
                       local_68._M_dataplus._M_p + sVar9);
            std::__cxx11::string::append((char *)&local_90);
            std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            psVar8 = cmSourceFile::GetFullPath(local_40,(string *)0x0);
            sVar6 = psVar8->_M_string_length;
            if (sVar6 == local_68._M_string_length) {
              if (sVar6 != 0) {
                uVar5 = bcmp((psVar8->_M_dataplus)._M_p,local_68._M_dataplus._M_p,sVar6);
                psVar8 = (string *)(ulong)uVar5;
                if (uVar5 != 0) goto LAB_0027f994;
              }
              local_6c = (uint)CONCAT71((int7)((ulong)psVar8 >> 8),1);
              std::__cxx11::string::_M_assign(local_48);
            }
LAB_0027f994:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 != local_38);
        }
      }
    }
    if ((local_6c & 1) == 0) {
      bVar3 = cmsys::RegularExpression::find
                        (&this->ComplainFileRegularExpression,(info->IncludeName)._M_dataplus._M_p,
                         &(this->ComplainFileRegularExpression).regmatch);
      if (bVar3) {
        cmSystemTools::Error("error cannot find dependencies for ",filename,(char *)0x0,(char *)0x0)
        ;
      }
      else {
        (info->FullPath)._M_string_length = 0;
        *(info->FullPath)._M_dataplus._M_p = '\0';
      }
    }
  }
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const char* path = info->FullPath.c_str();
    if (!path) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file.c_str());
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->GetFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath = incpath + "/";
            }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for ", path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }